

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

int write_central_dir(FILE *zip,file_sorted_t *filep)

{
  undefined2 uVar1;
  undefined2 uVar3;
  undefined4 uVar2;
  undefined2 uVar4;
  undefined2 uVar6;
  undefined4 uVar5;
  file_entry_t *pfVar7;
  char *__s;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined4 local_50;
  undefined4 local_4c;
  short local_48;
  short local_46;
  undefined4 local_44;
  undefined8 local_40;
  uint local_38;
  undefined2 local_34;
  undefined8 local_32;
  undefined4 local_2a;
  uint local_26;
  
  pfVar7 = filep->file;
  local_50 = 0x2014b50;
  local_46 = pfVar7->method;
  local_4c = 0x140014;
  local_48 = (ushort)(local_46 == 8) * 2;
  uVar1 = pfVar7->date;
  uVar3 = pfVar7->time;
  uVar4 = pfVar7->method;
  uVar6 = *(undefined2 *)&pfVar7->field_0x26;
  auVar9._6_2_ = uVar6;
  auVar9._4_2_ = uVar4;
  auVar9._2_2_ = uVar3;
  auVar9._0_2_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9 = pshuflw(auVar9,auVar9,0xe1);
  local_44 = auVar9._0_4_;
  uVar2 = pfVar7->compressed_size;
  uVar5 = pfVar7->crc32;
  local_40 = CONCAT44(uVar2,uVar5);
  local_38 = pfVar7->uncompressed_size;
  sVar8 = strlen(filep->path_in_zip);
  local_34 = (undefined2)sVar8;
  local_32 = 0;
  local_2a = 0;
  local_26 = pfVar7->zip_offset;
  sVar8 = fwrite(&local_50,0x2e,1,(FILE *)zip);
  if (sVar8 == 1) {
    __s = filep->path_in_zip;
    sVar8 = strlen(__s);
    sVar8 = fwrite(__s,sVar8,1,(FILE *)zip);
    if (sVar8 == 1) {
      return 0;
    }
  }
  write_central_dir_cold_1();
  return 1;
}

Assistant:

int write_central_dir(FILE *zip, file_sorted_t *filep)
{
	CentralDirectoryEntry dir;
	file_entry_t *file;

	file = filep->file;
	dir.Magic = ZIP_CENTRALFILE;
	dir.VersionMadeBy[0] = 20;
	dir.VersionMadeBy[1] = 0;
	dir.VersionToExtract[0] = method_to_version(file->method);
	dir.VersionToExtract[1] = 0;
	dir.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	dir.Method = LittleShort(file->method);
	dir.ModTime = file->time;
	dir.ModDate = file->date;
	dir.CRC32 = file->crc32;
	dir.CompressedSize = LittleLong(file->compressed_size);
	dir.UncompressedSize = LittleLong(file->uncompressed_size);
	dir.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	dir.ExtraLength = 0;
	dir.CommentLength = 0;
	dir.StartingDiskNumber = 0;
	dir.InternalAttributes = 0;
	dir.ExternalAttributes = 0;
	dir.LocalHeaderOffset = LittleLong(file->zip_offset);

	if (fwrite(&dir, sizeof(dir), 1, zip) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip) != 1)
	{
		fprintf(stderr, "Error writing central directory header for %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	return 0;
}